

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosinski-moduled-compress.c
# Opt level: O3

void KosinskiCompressModuled
               (size_t file_size,KosinskiCompressCallbacks *callbacks,cc_bool print_debug_messages)

{
  ulong uVar1;
  KosinskiCompressCallbacks new_callbacks;
  CallbacksAndCounter callbacks_and_counter;
  KosinskiCompressCallbacks local_50;
  KosinskiCompressCallbacks *local_30;
  undefined4 local_28;
  
  if (file_size != 0xa000 && file_size < 0x10000) {
    (*callbacks->write_byte)(callbacks->write_byte_user_data,(uint)(file_size >> 8));
    (*callbacks->write_byte)(callbacks->write_byte_user_data,(uint)file_size & 0xff);
    local_50.read_byte_user_data = &local_30;
    local_50.read_byte = ReadByte;
    local_50.write_byte_user_data = callbacks->write_byte_user_data;
    local_50.write_byte = callbacks->write_byte;
    if (file_size != 0) {
      uVar1 = 0;
      local_30 = callbacks;
      do {
        local_28 = 0x1000;
        KosinskiCompress(&local_50,print_debug_messages);
        uVar1 = uVar1 + 0x1000;
      } while (uVar1 < file_size);
    }
  }
  return;
}

Assistant:

void KosinskiCompressModuled(const size_t file_size, const KosinskiCompressCallbacks* const callbacks, const cc_bool print_debug_messages)
{
	size_t file_index;

	if (file_size > 0xFFFF || file_size == 0xA000) /* For some reason, 0xA000 is forced to 0x8000 in Sonic 3 & Knuckles' `Process_Kos_Module_Queue_Init` function. */
		return;	/* Cannot fit size of file in header - give up */ /* TODO: Error code? */

	callbacks->write_byte((void*)callbacks->write_byte_user_data, file_size >> 8);
	callbacks->write_byte((void*)callbacks->write_byte_user_data, file_size & 0xFF);

	CallbacksAndCounter callbacks_and_counter;
	callbacks_and_counter.callbacks = callbacks;

	KosinskiCompressCallbacks new_callbacks;
	new_callbacks.read_byte_user_data = &callbacks_and_counter;
	new_callbacks.read_byte = ReadByte;
	new_callbacks.write_byte_user_data = callbacks->write_byte_user_data;
	new_callbacks.write_byte = callbacks->write_byte;

	for (file_index = 0; file_index < file_size; file_index += MODULE_SIZE)
	{
		callbacks_and_counter.bytes_remaining = MODULE_SIZE;
		KosinskiCompress(&new_callbacks, print_debug_messages);
	}
}